

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O1

int testUTF8(int param_1,char **param_2)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  char *pcVar3;
  size_t sVar4;
  test_utf8_entry *ptVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char *__format;
  uint uVar9;
  ulong unaff_R13;
  int iVar10;
  test_utf8_char *ptVar11;
  char **ppcVar12;
  test_utf8_char c;
  test_utf8_char c_00;
  test_utf8_char c_01;
  test_utf8_char c_02;
  test_utf8_char s;
  test_utf8_char s_00;
  test_utf8_char s_01;
  test_utf8_char s_02;
  test_utf8_char s_03;
  test_utf8_char s_04;
  uint uc;
  undefined8 local_38;
  
  sVar7 = 1;
  ptVar5 = good_entry;
  iVar10 = 0;
  local_38 = in_RAX;
  do {
    ptVar5 = ptVar5 + 1;
    pcVar6 = ptVar5[-1].str._M_str;
    pcVar3 = cm_utf8_decode_character(pcVar6,pcVar6 + sVar7,(uint *)&local_38);
    if (pcVar3 != (char *)0x0) {
      uVar9 = ptVar5[-1].chr;
      if ((uint)local_38 == uVar9) {
        uVar9 = (int)pcVar3 - (int)pcVar6;
        if (uVar9 == (uint)sVar7) {
          c._M_str = pcVar6;
          c._M_len = sVar7;
          report_good(true,c);
          printf("got 0x%04X\n",local_38 & 0xffffffff);
          unaff_R13 = 1;
          goto LAB_001da99b;
        }
        c_01._M_str = pcVar6;
        c_01._M_len = sVar7;
        report_good(false,c_01);
        __format = "had %d bytes, used %d\n";
        uVar8 = sVar7 & 0xffffffff;
      }
      else {
        c_00._M_str = pcVar6;
        c_00._M_len = sVar7;
        report_good(false,c_00);
        __format = "expected 0x%04X, got 0x%04X\n";
        uVar8 = (ulong)uVar9;
        uVar9 = (uint)local_38;
      }
      unaff_R13 = 0;
      printf(__format,uVar8,(ulong)uVar9);
    }
LAB_001da99b:
    if (pcVar3 == (char *)0x0) {
      unaff_R13 = 0;
      c_02._M_str = pcVar6;
      c_02._M_len = sVar7;
      report_good(false,c_02);
      puts("failed");
    }
    s._M_str = pcVar6;
    s._M_len = sVar7;
    bVar1 = is_valid(s);
    if (!bVar1) {
      iVar10 = 1;
    }
    if ((unaff_R13 & 1) == 0) {
      iVar10 = 1;
    }
    sVar7 = (ptVar5->str)._M_len;
    if (sVar7 == 0) {
      sVar7 = 1;
      ptVar11 = bad_chars;
      do {
        ptVar11 = ptVar11 + 1;
        pcVar6 = ptVar11[-1]._M_str;
        local_38 = CONCAT44(0xffff,(uint)local_38);
        pcVar3 = cm_utf8_decode_character(pcVar6,pcVar6 + sVar7,(uint *)((long)&local_38 + 4));
        if (pcVar3 == (char *)0x0) {
          printf("%s: decoding bad  ","pass");
          s_01._M_str = pcVar6;
          s_01._M_len = sVar7;
          byte_array_print(s_01);
          putchar(0x20);
          puts("failed as expected");
        }
        else {
          printf("%s: decoding bad  ","FAIL");
          s_00._M_str = pcVar6;
          s_00._M_len = sVar7;
          byte_array_print(s_00);
          putchar(0x20);
          printf("expected failure, got 0x%04X\n",local_38 >> 0x20);
          iVar10 = 1;
        }
        s_02._M_str = pcVar6;
        s_02._M_len = sVar7;
        bVar1 = is_invalid(s_02);
        if (!bVar1) {
          iVar10 = 1;
        }
        sVar7 = ptVar11->_M_len;
      } while (sVar7 != 0);
      pcVar6 = "";
      ppcVar12 = good_strings;
      do {
        ppcVar12 = ppcVar12 + 1;
        sVar4 = strlen(pcVar6);
        s_03._M_str = pcVar6;
        s_03._M_len = sVar4;
        bVar1 = is_valid(s_03);
        if (!bVar1) {
          iVar10 = 1;
        }
        pcVar6 = *ppcVar12;
      } while (pcVar6 != (char *)0x0);
      s_04._M_str = anon_var_dwarf_16e73e;
      s_04._M_len = 2;
      bVar1 = is_invalid(s_04);
      iVar2 = 1;
      if (bVar1) {
        iVar2 = iVar10;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

int testUTF8(int /*unused*/, char* /*unused*/[])
{
  int result = 0;
  for (test_utf8_entry const* e = good_entry; !e->str.empty(); ++e) {
    if (!decode_good(*e)) {
      result = 1;
    }
    if (!is_valid(e->str)) {
      result = 1;
    }
  }
  for (test_utf8_char* c = bad_chars; !(*c).empty(); ++c) {
    if (!decode_bad(*c)) {
      result = 1;
    }
    if (!is_invalid(*c)) {
      result = 1;
    }
  }
  for (char const** s = good_strings; *s; ++s) {
    if (!is_valid(*s)) {
      result = 1;
    }
  }
  for (char const** s = bad_strings; *s; ++s) {
    if (!is_invalid(*s)) {
      result = 1;
    }
  }
  return result;
}